

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcplisten.c
# Opt level: O0

int nni_tcp_listener_alloc(nng_stream_listener **lp,nng_url *url)

{
  undefined1 local_b0 [8];
  nng_sockaddr sa;
  nng_url *pnStack_20;
  int rv;
  nng_url *url_local;
  nng_stream_listener **lp_local;
  
  pnStack_20 = url;
  url_local = (nng_url *)lp;
  sa.s_storage.sa_pad[0xf]._4_4_ = nni_url_to_address((nng_sockaddr *)local_b0,url);
  lp_local._4_4_ = sa.s_storage.sa_pad[0xf]._4_4_;
  if (sa.s_storage.sa_pad[0xf]._4_4_ == 0) {
    lp_local._4_4_ =
         tcp_listener_alloc_addr((nng_stream_listener **)url_local,(nng_sockaddr *)local_b0);
  }
  return lp_local._4_4_;
}

Assistant:

int
nni_tcp_listener_alloc(nng_stream_listener **lp, const nng_url *url)
{
	int          rv;
	nng_sockaddr sa;

	if ((rv = nni_url_to_address(&sa, url)) != 0) {
		return (rv);
	}

	return (tcp_listener_alloc_addr(lp, &sa));
}